

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_import.cpp
# Opt level: O0

void __thiscall UnitsImport_basics_Test::~UnitsImport_basics_Test(UnitsImport_basics_Test *this)

{
  UnitsImport_basics_Test *this_local;
  
  ~UnitsImport_basics_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UnitsImport, basics)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"a-model.xml\">\n"
        "    <units units_ref=\"bob\" name=\"\"/>\n"
        "  </import>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ImportSourcePtr imp = libcellml::ImportSource::create();
    imp->setUrl("a-model.xml");

    libcellml::UnitsPtr u = libcellml::Units::create();

    EXPECT_EQ(u->importSource(), nullptr);
    EXPECT_EQ(u->importReference(), "");

    u->setImportSource(imp);
    u->setImportReference("bob");

    EXPECT_EQ(u->importSource(), imp);
    EXPECT_EQ(u->importReference(), "bob");

    m->addUnits(u);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);
}